

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::get_pathname(char *p,dynamic_string *path)

{
  dynamic_string *in_RSI;
  dynamic_string temp_path;
  dynamic_string temp_drive;
  dynamic_string *in_stack_000007d8;
  dynamic_string *in_stack_000007e0;
  dynamic_string *in_stack_000007e8;
  dynamic_string *in_stack_000007f0;
  char *in_stack_000007f8;
  dynamic_string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  dynamic_string *in_stack_ffffffffffffffd0;
  dynamic_string local_28;
  dynamic_string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  dynamic_string::dynamic_string(&local_28);
  dynamic_string::dynamic_string((dynamic_string *)&stack0xffffffffffffffc8);
  local_1 = split_path(in_stack_000007f8,in_stack_000007f0,in_stack_000007e8,in_stack_000007e0,
                       in_stack_000007d8);
  if ((bool)local_1) {
    dynamic_string::get_ptr(&local_28);
    dynamic_string::get_ptr((dynamic_string *)&stack0xffffffffffffffc8);
    combine_path(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffa0 = local_18;
  }
  dynamic_string::~dynamic_string(in_stack_ffffffffffffffa0);
  dynamic_string::~dynamic_string(in_stack_ffffffffffffffa0);
  return (bool)(local_1 & 1);
}

Assistant:

bool file_utils::get_pathname(const char* p, dynamic_string& path) {
  dynamic_string temp_drive, temp_path;
  if (!split_path(p, &temp_drive, &temp_path, NULL, NULL))
    return false;

  combine_path(path, temp_drive.get_ptr(), temp_path.get_ptr());
  return true;
}